

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

void internalSubsetTokenizer(void *ctx,xmlChar *name,xmlChar *publicId,xmlChar *systemId)

{
  xmlChar *local_68;
  xmlChar *local_58;
  xmlChar *local_48;
  xmlTokenizerConfig *config;
  xmlParserCtxtPtr ctxt;
  xmlChar *systemId_local;
  xmlChar *publicId_local;
  xmlChar *name_local;
  void *ctx_local;
  
  pendingTokenizer(*(xmlTokenizerConfig **)((long)ctx + 0x1a8));
  local_48 = name;
  if (name == (xmlChar *)0x0) {
    local_48 = "<none>";
  }
  local_58 = publicId;
  if (publicId == (xmlChar *)0x0) {
    local_58 = "<none>";
  }
  local_68 = systemId;
  if (systemId == (xmlChar *)0x0) {
    local_68 = "<none>";
  }
  fprintf((FILE *)SAXdebug,"DOCTYPE\n%s\n%s\n%s\n",local_48,local_58,local_68);
  return;
}

Assistant:

static void
internalSubsetTokenizer(void *ctx, const xmlChar *name,
                        const xmlChar *publicId, const xmlChar *systemId) {
    xmlParserCtxtPtr ctxt = ctx;
    xmlTokenizerConfig *config = ctxt->_private;

    pendingTokenizer(config);

    fprintf(SAXdebug, "DOCTYPE\n%s\n%s\n%s\n",
            name ? name : BAD_CAST "<none>",
            publicId ? publicId : BAD_CAST "<none>",
            systemId ? systemId : BAD_CAST "<none>");
}